

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

uint32_t helper_get_cp_reg_aarch64(CPUARMState_conflict *env,void *rip)

{
  uint32_t uVar1;
  
  uVar1 = (**(code **)((long)rip + 0x50))();
  return uVar1;
}

Assistant:

uint32_t HELPER(get_cp_reg)(CPUARMState *env, void *rip)
{
    const ARMCPRegInfo *ri = rip;
    uint32_t res;

    if (ri->type & ARM_CP_IO) {
        res = ri->readfn(env, ri);
    } else {
        res = ri->readfn(env, ri);
    }

    return res;
}